

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

bool __thiscall
tlx::CmdlineParser::ArgumentUnsigned::process(ArgumentUnsigned *this,int *argc,char ***argv)

{
  bool bVar1;
  char *in_RAX;
  ulong uVar2;
  char *endptr;
  
  if (*argc != 0) {
    endptr = in_RAX;
    uVar2 = strtoul(**argv,&endptr,10);
    if ((endptr == (char *)0x0) || (uVar2 >> 0x20 != 0 || *endptr != '\0')) {
      bVar1 = false;
    }
    else {
      *argc = *argc + -1;
      *argv = *argv + 1;
      *this->dest_ = (uint)uVar2;
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        char* endptr;
        unsigned long x = strtoul(argv[0], &endptr, 10);
        if (endptr != nullptr && *endptr == 0 &&
            x <= std::numeric_limits<unsigned int>::max()) {
            --argc, ++argv;
            dest_ = static_cast<unsigned int>(x);
            return true;
        }
        else {
            return false;
        }
    }